

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

result __thiscall
fmt::v6::internal::fixed_handler::on_start
          (fixed_handler *this,uint64_t divisor,uint64_t remainder,uint64_t error,int *exp)

{
  int iVar1;
  int iVar2;
  int iVar3;
  round_direction rVar4;
  result rVar5;
  
  rVar5 = more;
  if (this->fixed == true) {
    iVar2 = this->exp10 + *exp;
    iVar1 = this->precision;
    iVar3 = iVar2 + this->precision;
    this->precision = iVar3;
    if (iVar3 == 0 || SCARRY4(iVar2,iVar1) != iVar3 < 0) {
      rVar5 = done;
      if (iVar3 >= 0) {
        rVar4 = get_round_direction(divisor,remainder,error);
        if (rVar4 == unknown) {
          rVar5 = error;
        }
        else {
          iVar1 = this->size;
          this->size = iVar1 + 1;
          this->buf[iVar1] = rVar4 == up | 0x30;
        }
      }
    }
  }
  return rVar5;
}

Assistant:

digits::result on_start(uint64_t divisor, uint64_t remainder, uint64_t error,
                          int& exp) {
    // Non-fixed formats require at least one digit and no precision adjustment.
    if (!fixed) return digits::more;
    // Adjust fixed precision by exponent because it is relative to decimal
    // point.
    precision += exp + exp10;
    // Check if precision is satisfied just by leading zeros, e.g.
    // format("{:.2f}", 0.001) gives "0.00" without generating any digits.
    if (precision > 0) return digits::more;
    if (precision < 0) return digits::done;
    auto dir = get_round_direction(divisor, remainder, error);
    if (dir == round_direction::unknown) return digits::error;
    buf[size++] = dir == round_direction::up ? '1' : '0';
    return digits::done;
  }